

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O2

void hash_release(void)

{
  hash_entry *phVar1;
  int i;
  long lVar2;
  hash_entry_t *__ptr;
  
  for (lVar2 = 0; lVar2 < map_weight_nodes.length; lVar2 = lVar2 + 1) {
    __ptr = map_weight_nodes.buckets[lVar2];
    while (__ptr != (hash_entry_t *)0x0) {
      phVar1 = __ptr->next;
      free(__ptr);
      __ptr = phVar1;
    }
  }
  return;
}

Assistant:

void hash_release() {
    for (int i = 0; i < map_weight_nodes.length; ++i) {
        hash_entry_t  *entry = map_weight_nodes.buckets[i];
        while(entry) {
            hash_entry_t  *next = entry->next;
            free(entry);
            entry = next;
        }
    }
    //moved to stack with fixed size
    //free(map_weight_nodes.buckets);

#ifdef _DEBUG
    fprintf(stdout, "total number of collision: %ld\n", collision);
    collision = 0;
#endif
}